

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::RepeatedStringFieldGenerator::GenerateParsingCodeFromPacked
          (RepeatedStringFieldGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,&this->variables_,
                     "int length = input.readRawVarint32();\nint limit = input.pushLimit(length);\nif (!$get_mutable_bit_parser$ && input.getBytesUntilLimit() > 0) {\n  $name$_ = new com.google.protobuf.LazyStringArrayList();\n  $set_mutable_bit_parser$;\n}\nwhile (input.getBytesUntilLimit() > 0) {\n  $name$.add(input.read$capitalized_type$());\n}\ninput.popLimit(limit);\n"
                    );
  return;
}

Assistant:

void RepeatedStringFieldGenerator::
GenerateParsingCodeFromPacked(io::Printer* printer) const {
  printer->Print(variables_,
    "int length = input.readRawVarint32();\n"
    "int limit = input.pushLimit(length);\n"
    "if (!$get_mutable_bit_parser$ && input.getBytesUntilLimit() > 0) {\n"
    "  $name$_ = new com.google.protobuf.LazyStringArrayList();\n"
    "  $set_mutable_bit_parser$;\n"
    "}\n"
    "while (input.getBytesUntilLimit() > 0) {\n"
    "  $name$.add(input.read$capitalized_type$());\n"
    "}\n"
    "input.popLimit(limit);\n");
}